

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recalc.cpp
# Opt level: O0

void __thiscall Simplex::printTableau(Simplex *this,bool full)

{
  longdouble lVar1;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uVar7;
  void *pvVar8;
  uint *puVar9;
  longdouble *plVar10;
  void *pvVar11;
  void *pvVar12;
  int *piVar13;
  byte in_SIL;
  char *pcVar14;
  int *in_RDI;
  int i_5;
  int j_4;
  int i_4;
  int j_3;
  int j_2;
  int i_3;
  int i_2;
  longdouble **T;
  int j_1;
  int k;
  int j;
  int i_1;
  int i;
  longdouble *row;
  undefined2 in_stack_ffffffffffffff40;
  undefined2 in_stack_ffffffffffffff42;
  int in_stack_ffffffffffffff44;
  longdouble *in_stack_ffffffffffffff48;
  Simplex *in_stack_ffffffffffffff50;
  Simplex *in_stack_ffffffffffffff60;
  int local_54;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  uint local_2c;
  int local_28;
  int local_24;
  int local_20;
  uint local_1c;
  
  calcRHS((Simplex *)
          CONCAT44(in_stack_ffffffffffffff44,
                   CONCAT22(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40)));
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(*in_RDI + in_RDI[1]);
  uVar7 = SUB168(auVar4 * ZEXT816(0x10),0);
  if (SUB168(auVar4 * ZEXT816(0x10),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar8 = operator_new__(uVar7);
  fprintf(_stderr,"Tableau:\n");
  for (local_1c = 0; (int)local_1c < *in_RDI + in_RDI[1]; local_1c = local_1c + 1) {
    fprintf(_stderr,"%d:%d ",(ulong)local_1c,
            (ulong)*(uint *)(*(long *)(in_RDI + 0x52) + (long)(int)local_1c * 4));
  }
  pcVar14 = "\n";
  fprintf(_stderr,"\n");
  for (local_20 = 0; local_20 < in_RDI[1]; local_20 = local_20 + 1) {
    pcVar14 = (char *)((long)pvVar8 + (long)*in_RDI * 0x10);
    calcBInvRow(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff44);
    for (local_24 = 0; local_24 < *in_RDI; local_24 = local_24 + 1) {
      *(longdouble *)((long)pvVar8 + (long)local_24 * 0x10) = (longdouble)0;
      for (local_28 = 0; local_28 < *(int *)(*(long *)(in_RDI + 0xe) + (long)local_24 * 4);
          local_28 = local_28 + 1) {
        iVar2 = *in_RDI;
        puVar9 = (uint *)IndexVal::index((IndexVal *)
                                         (*(long *)(*(long *)(in_RDI + 6) + (long)local_24 * 8) +
                                         (long)local_28 * 0x10),pcVar14,local_24);
        pcVar14 = (char *)(ulong)*puVar9;
        lVar1 = *(longdouble *)((long)pvVar8 + (long)(int)(iVar2 + *puVar9) * 0x10);
        plVar10 = IndexVal::val((IndexVal *)
                                (*(long *)(*(long *)(in_RDI + 6) + (long)local_24 * 8) +
                                (long)local_28 * 0x10));
        *(longdouble *)((long)pvVar8 + (long)local_24 * 0x10) =
             lVar1 * *plVar10 + *(longdouble *)((long)pvVar8 + (long)local_24 * 0x10);
      }
    }
    fprintf(_stderr,"%d: ",(ulong)*(uint *)(*(long *)(in_RDI + 0x4e) + (long)local_20 * 4));
    if ((in_SIL & 1) != 0) {
      for (local_2c = 0; (int)local_2c < *in_RDI + in_RDI[1]; local_2c = local_2c + 1) {
        fprintf(_stderr,"%d:%.3Lf ",(ulong)local_2c);
      }
    }
    fprintf(_stderr,"rhs:%.18Lf");
    pcVar14 = "\n";
    fprintf(_stderr,"\n");
  }
  printObjective(in_stack_ffffffffffffff60);
  fflush(_stderr);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(*in_RDI + in_RDI[1]);
  uVar7 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar7);
  for (local_3c = 0; local_3c < *in_RDI + in_RDI[1]; local_3c = local_3c + 1) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (long)in_RDI[1];
    uVar7 = SUB168(auVar6 * ZEXT816(0x10),0);
    if (SUB168(auVar6 * ZEXT816(0x10),8) != 0) {
      uVar7 = 0xffffffffffffffff;
    }
    pvVar12 = operator_new__(uVar7);
    *(void **)((long)pvVar11 + (long)local_3c * 8) = pvVar12;
  }
  for (local_40 = 0; local_40 < *in_RDI + in_RDI[1]; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < in_RDI[1]; local_44 = local_44 + 1) {
      *(longdouble *)(*(long *)((long)pvVar11 + (long)local_40 * 8) + (long)local_44 * 0x10) =
           (longdouble)0;
    }
    for (local_48 = 0; local_48 < *(int *)(*(long *)(in_RDI + 0xe) + (long)local_40 * 4);
        local_48 = local_48 + 1) {
      plVar10 = IndexVal::val((IndexVal *)
                              (*(long *)(*(long *)(in_RDI + 6) + (long)local_40 * 8) +
                              (long)local_48 * 0x10));
      lVar1 = *plVar10;
      lVar3 = *(long *)((long)pvVar11 + (long)local_40 * 8);
      piVar13 = (int *)IndexVal::index((IndexVal *)
                                       (*(long *)(*(long *)(in_RDI + 6) + (long)local_40 * 8) +
                                       (long)local_48 * 0x10),pcVar14,(int)lVar3);
      *(longdouble *)(lVar3 + (long)*piVar13 * 0x10) = lVar1;
    }
    pcVar14 = *(char **)((long)pvVar11 + (long)local_40 * 8);
    Bmultiply(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  for (local_4c = 0; local_4c < in_RDI[1]; local_4c = local_4c + 1) {
    fprintf(_stderr,"%d: ",(ulong)*(uint *)(*(long *)(in_RDI + 0x4e) + (long)local_4c * 4));
    for (local_50 = 0; (int)local_50 < *in_RDI + in_RDI[1]; local_50 = local_50 + 1) {
      fprintf(_stderr,"%d:%.3Lf ",(ulong)local_50);
    }
    fprintf(_stderr,"\n");
  }
  if (pvVar8 != (void *)0x0) {
    operator_delete__(pvVar8);
  }
  for (local_54 = 0; local_54 < *in_RDI + in_RDI[1]; local_54 = local_54 + 1) {
    pvVar8 = *(void **)((long)pvVar11 + (long)local_54 * 8);
    if (pvVar8 != (void *)0x0) {
      operator_delete(pvVar8);
    }
  }
  if (pvVar11 != (void *)0x0) {
    operator_delete__(pvVar11);
  }
  return;
}

Assistant:

void Simplex::printTableau(bool full) {
	calcRHS();
	//	long double row[n+m];
	auto* row = new long double[n + m];
	fprintf(stderr, "Tableau:\n");
	for (int i = 0; i < n + m; i++) {
		fprintf(stderr, "%d:%d ", i, shift[i]);
	}
	fprintf(stderr, "\n");
	for (int i = 0; i < m; i++) {
		calcBInvRow(&row[n], i);
		for (int j = 0; j < n; j++) {
			row[j] = 0;
			for (int k = 0; k < AV_nz[j]; k++) {
				row[j] += row[n + AV[j][k].index()] * AV[j][k].val();
			}
		}
		fprintf(stderr, "%d: ", rtoc[i]);
		if (full) {
			for (int j = 0; j < n + m; j++) {
				fprintf(stderr, "%d:%.3Lf ", j, row[j]);
			}
		}
		fprintf(stderr, "rhs:%.18Lf", rhs[i]);
		fprintf(stderr, "\n");
		//		row[rtoc[i]] -= 1;
		//		for (int j = 0; j < m; j++) {
		//			if (!almostZero6(row[rtoc[j]])) fprintf(stderr, "%d:%d:%.2Lf ", i, j, row[rtoc[j]]);
		//			assert(almostZero6(row[rtoc[j]]));
		//		}
	}
	printObjective();
	fflush(stderr);

	//	long double T[n+m][m];
	auto** T = new long double*[n + m];
	for (int i = 0; i < n + m; i++) {
		T[i] = new long double[m];
	}
	for (int i = 0; i < n + m; i++) {
		for (int j = 0; j < m; j++) {
			T[i][j] = 0;
		}
		for (int j = 0; j < AV_nz[i]; j++) {
			T[i][AV[i][j].index()] = AV[i][j].val();
		}
		Bmultiply(T[i]);
	}

	for (int i = 0; i < m; i++) {
		fprintf(stderr, "%d: ", rtoc[i]);
		for (int j = 0; j < n + m; j++) {
			fprintf(stderr, "%d:%.3Lf ", j, T[j][i]);
		}
		fprintf(stderr, "\n");
	}

	delete[] row;
	for (int i = 0; i < n + m; i++) {
		delete T[i];
	}
	delete[] T;
}